

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckHeaderNesting(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  uint uVar4;
  uint uVar5;
  ctmbstr str;
  uint nested;
  uint level;
  ctmbstr word;
  Bool NeedsDescription;
  Bool IsValidIncrease;
  int numWords;
  uint i;
  Node *temp;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  NeedsDescription = yes;
  bVar1 = false;
  bVar2 = false;
  BVar3 = Level2_Enabled(doc);
  if (BVar3 != no) {
    if ((node->content != (Node *)0x0) && (node->content->tag == (Dict *)0x0)) {
      str = textFromOneNode(doc,node->content);
      for (IsValidIncrease = no; BVar3 = prvTidytmbstrlen(str), IsValidIncrease < BVar3;
          IsValidIncrease = IsValidIncrease + yes) {
        if (str[IsValidIncrease] == ' ') {
          NeedsDescription = NeedsDescription + yes;
        }
      }
      bVar2 = 0x14 < (int)NeedsDescription;
    }
    BVar3 = prvTidynodeIsHeader(node);
    if (BVar3 != no) {
      uVar4 = prvTidynodeHeaderLevel(node);
      bVar1 = true;
      for (_numWords = node->next; _numWords != (Node *)0x0; _numWords = _numWords->next) {
        uVar5 = prvTidynodeHeaderLevel(_numWords);
        if (uVar4 <= uVar5) {
          bVar1 = uVar5 <= uVar4 + 1;
          break;
        }
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,node,0x2b7);
    }
    if (bVar2) {
      prvTidyReportAccessError(doc,node,699);
    }
  }
  return;
}

Assistant:

static void CheckHeaderNesting( TidyDocImpl* doc, Node* node )
{
    Node* temp;
    uint i;
    int numWords = 1;

    Bool IsValidIncrease = no;
    Bool NeedsDescription = no;

    if (Level2_Enabled( doc ))
    {
        /* 
           Text within header element cannot contain more than 20 words without
           a separate description
        */
        if (node->content != NULL && node->content->tag == NULL)
        {
            ctmbstr word = textFromOneNode( doc, node->content);

            for (i = 0; i < TY_(tmbstrlen)(word); i++)
            {
                if (word[i] == ' ')
                {
                    numWords++;
                }
            }

            if (numWords > 20)
            {
                NeedsDescription = yes;
            }
        }

        /* Header following must be same level or same plus 1 for
        ** valid heading increase size.  E.g. H1 -> H1, H2.  H3 -> H3, H4
        */
        if ( TY_(nodeIsHeader)(node) )
        {
            uint level = TY_(nodeHeaderLevel)( node );
            IsValidIncrease = yes;

            for ( temp = node->next; temp != NULL; temp = temp->next )
            {
                uint nested = TY_(nodeHeaderLevel)( temp );
                if ( nested >= level )
                {
                    IsValidIncrease = ( nested <= level + 1 );
                    break;
                }
            }
        }

        if ( !IsValidIncrease )
            TY_(ReportAccessError)( doc, node, HEADERS_IMPROPERLY_NESTED );
    
        if ( NeedsDescription )
            TY_(ReportAccessError)( doc, node, HEADER_USED_FORMAT_TEXT );    
    }
}